

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  undefined1 auVar1 [16];
  bool bVar2;
  longlong lVar3;
  longlong lVar4;
  long lVar5;
  long lVar6;
  long pos;
  ulong uVar7;
  long lVar8;
  long len;
  TrackPosition *tp;
  longlong local_40;
  long local_38;
  
  lVar6 = this->m_timecode;
  bVar2 = true;
  if (lVar6 < 0) {
    if (this->m_track_positions != (TrackPosition *)0x0) {
      __assert_fail("m_track_positions == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8eb,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    if (this->m_track_positions_count != 0) {
      __assert_fail("m_track_positions_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8ec,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    lVar3 = ReadID(pReader,-lVar6,&len);
    if (lVar3 == 0xbb) {
      lVar5 = len - lVar6;
      local_38 = -lVar6;
      lVar3 = ReadUInt(pReader,lVar5,&len);
      if (lVar3 < 0) {
        __assert_fail("size >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x8fd,"bool mkvparser::CuePoint::Load(IMkvReader *)");
      }
      lVar5 = lVar5 + len;
      lVar8 = lVar3 + lVar5;
      local_40 = lVar6 + lVar8;
      lVar6 = lVar5;
      while (lVar6 < lVar8) {
        lVar3 = ReadID(pReader,lVar6,&len);
        if ((((lVar3 < 0) || (lVar6 = lVar6 + len, lVar8 < lVar6)) ||
            (lVar4 = ReadUInt(pReader,lVar6,&len), lVar4 < 0)) ||
           ((pos = lVar6 + len, lVar8 < pos || (lVar6 = pos + lVar4, lVar8 < lVar6))))
        goto LAB_001118da;
        if (lVar3 == 0xb7) {
          this->m_track_positions_count = this->m_track_positions_count + 1;
        }
        else if (lVar3 == 0xb3) {
          lVar3 = UnserializeUInt(pReader,pos,lVar4);
          this->m_timecode = lVar3;
        }
      }
      if ((-1 < this->m_timecode) && (this->m_track_positions_count != 0)) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = this->m_track_positions_count;
        uVar7 = 0xffffffffffffffff;
        if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
          uVar7 = SUB168(auVar1 * ZEXT816(0x18),0);
        }
        tp = (TrackPosition *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
        this->m_track_positions = tp;
        if (tp != (TrackPosition *)0x0) {
          while( true ) {
            if (lVar8 <= lVar5) {
              if (((long)tp - (long)this->m_track_positions) / 0x18 == this->m_track_positions_count
                 ) {
                this->m_element_start = local_38;
                this->m_element_size = local_40;
                return true;
              }
              __assert_fail("size_t(p - m_track_positions) == m_track_positions_count",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x955,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            lVar3 = ReadID(pReader,lVar5,&len);
            if ((lVar3 < 0) || (lVar5 = lVar5 + len, lVar8 < lVar5)) break;
            lVar4 = ReadUInt(pReader,lVar5,&len);
            if (lVar4 < 0) {
              __assert_fail("size >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x943,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            lVar6 = lVar5 + len;
            if (lVar8 < lVar6) {
              __assert_fail("(pos + len) <= stop",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x944,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            lVar5 = lVar6 + lVar4;
            if (lVar8 < lVar5) {
              __assert_fail("(pos + size) <= stop",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x947,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            if (lVar3 == 0xb7) {
              bVar2 = TrackPosition::Parse(tp,pReader,lVar6,lVar4);
              if (!bVar2) break;
              tp = tp + 1;
            }
          }
        }
      }
    }
LAB_001118da:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions)
      ++m_track_positions_count;

    pos += size;  // consume payload
  }

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}